

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O0

Utest * __thiscall
TEST_WiningStateTest_Not_OneShot_ReadyOnly_TestShell::createTest
          (TEST_WiningStateTest_Not_OneShot_ReadyOnly_TestShell *this)

{
  TEST_WiningStateTest_Not_OneShot_ReadyOnly_Test *this_00;
  char *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  TEST_WiningStateTest_Not_OneShot_ReadyOnly_TestShell *this_local;
  
  this_00 = (TEST_WiningStateTest_Not_OneShot_ReadyOnly_Test *)
            operator_new(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,0);
  TEST_WiningStateTest_Not_OneShot_ReadyOnly_Test::TEST_WiningStateTest_Not_OneShot_ReadyOnly_Test
            (this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(WiningStateTest, Not_OneShot_ReadyOnly)
{
	addNoWiningHand();

	SelfDrawnSituation situation;
	situation.is_one_shot = true;

	selfDrawn(situation);
	auto r = c.report();

	CHECK_EQUAL(0, r.patterns.count(Pattern::OneShot));
}